

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.c
# Opt level: O1

ASYNC_OPERATION_HANDLE
cbs_delete_token_async
          (CBS_HANDLE cbs,char *type,char *audience,
          ON_CBS_OPERATION_COMPLETE on_cbs_delete_token_complete,
          void *on_cbs_delete_token_complete_context)

{
  SINGLYLINKEDLIST_HANDLE list;
  int iVar1;
  LOGGER_LOG p_Var2;
  MESSAGE_HANDLE message;
  AMQP_VALUE map;
  ASYNC_OPERATION_HANDLE async_operation;
  LIST_ITEM_HANDLE item;
  ASYNC_OPERATION_HANDLE pAVar3;
  char *value;
  char *pcVar4;
  
  if ((audience == (char *)0x0 || (type == (char *)0x0 || cbs == (CBS_HANDLE)0x0)) ||
      on_cbs_delete_token_complete == (ON_CBS_OPERATION_COMPLETE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (ASYNC_OPERATION_HANDLE)0x0;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c",
              "cbs_delete_token_async",0x296,1,
              "Bad arguments: cbs = %p, type = %p, audience = %p, on_cbs_delete_token_complete = %p"
              ,cbs,type,audience,on_cbs_delete_token_complete);
    return (ASYNC_OPERATION_HANDLE)0x0;
  }
  if ((cbs->cbs_state == CBS_STATE_ERROR) || (cbs->cbs_state == CBS_STATE_CLOSED)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (ASYNC_OPERATION_HANDLE)0x0;
    }
    pcVar4 = "put token called while closed or in error";
    iVar1 = 0x29d;
LAB_0010ded3:
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c",
              "cbs_delete_token_async",iVar1,1,pcVar4);
    return (ASYNC_OPERATION_HANDLE)0x0;
  }
  message = message_create();
  if (message == (MESSAGE_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (ASYNC_OPERATION_HANDLE)0x0;
    }
    pcVar4 = "message_create failed";
    iVar1 = 0x2a8;
    goto LAB_0010ded3;
  }
  map = amqpvalue_create_map();
  if (map == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      async_operation = (ASYNC_OPERATION_HANDLE)0x0;
    }
    else {
      async_operation = (ASYNC_OPERATION_HANDLE)0x0;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c",
                "cbs_delete_token_async",0x2b1,1,"Failed creating application properties map");
    }
    goto LAB_0010dff7;
  }
  iVar1 = add_string_key_value_pair_to_map(map,audience,value);
  if (iVar1 == 0) {
    iVar1 = message_set_application_properties(message,map);
    if (iVar1 == 0) {
      async_operation = async_operation_create(cbs_put_token_cancel_handler,0x30);
      if (async_operation == (ASYNC_OPERATION_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar4 = "Failed allocating async operation context";
          iVar1 = 0x2c9;
          goto LAB_0010dfe4;
        }
      }
      else {
        async_operation[1].async_operation_cancel_handler =
             (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)on_cbs_delete_token_complete;
        async_operation[2].async_operation_cancel_handler =
             (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)on_cbs_delete_token_complete_context;
        list = cbs->pending_operations;
        async_operation[3].async_operation_cancel_handler =
             (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)list;
        async_operation[5].async_operation_cancel_handler =
             (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)async_operation;
        item = singlylinkedlist_add(list,async_operation + 1);
        if (item == (LIST_ITEM_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar4 = "Failed adding pending operation to list";
            iVar1 = 0x2d9;
LAB_0010e12a:
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c"
                      ,"cbs_delete_token_async",iVar1,1,pcVar4);
          }
        }
        else {
          pAVar3 = amqp_management_execute_operation_async
                             (cbs->amqp_management,"delete-token",type,(char *)0x0,message,
                              on_amqp_management_execute_operation_complete,item);
          async_operation[4].async_operation_cancel_handler =
               (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)pAVar3;
          if (pAVar3 != (ASYNC_OPERATION_HANDLE)0x0) goto LAB_0010df1a;
          singlylinkedlist_remove(cbs->pending_operations,item);
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar4 = "Failed starting AMQP management operation";
            iVar1 = 0x2f0;
            goto LAB_0010e12a;
          }
        }
        async_operation_destroy(async_operation);
      }
      goto LAB_0010df17;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0010df17;
    pcVar4 = "Failed setting message application properties";
    iVar1 = 0x2c0;
LAB_0010dfe4:
    async_operation = (ASYNC_OPERATION_HANDLE)0x0;
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c",
              "cbs_delete_token_async",iVar1,1,pcVar4);
  }
  else {
LAB_0010df17:
    async_operation = (ASYNC_OPERATION_HANDLE)0x0;
  }
LAB_0010df1a:
  amqpvalue_destroy(map);
LAB_0010dff7:
  message_destroy(message);
  return async_operation;
}

Assistant:

ASYNC_OPERATION_HANDLE cbs_delete_token_async(CBS_HANDLE cbs, const char* type, const char* audience, ON_CBS_OPERATION_COMPLETE on_cbs_delete_token_complete, void* on_cbs_delete_token_complete_context)
{
    ASYNC_OPERATION_HANDLE result;

    /* Codes_SRS_CBS_01_086: [ `on_cbs_delete_token_complete_context` shall be allowed to be NULL. ]*/
    if ((cbs == NULL) ||
        (type == NULL) ||
        (audience == NULL) ||
        (on_cbs_delete_token_complete == NULL))
    {
        /* Codes_SRS_CBS_01_060: [ If any of the arguments `cbs`, `type`, `audience` or `on_cbs_delete_token_complete` is NULL `cbs_put_token_async` shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: cbs = %p, type = %p, audience = %p, on_cbs_delete_token_complete = %p",
            cbs, type, audience, on_cbs_delete_token_complete);
        result = NULL;
    }
    else if ((cbs->cbs_state == CBS_STATE_CLOSED) ||
        (cbs->cbs_state == CBS_STATE_ERROR))
    {
        /* Codes_SRS_CBS_01_067: [ If `cbs_delete_token_async` is called when the CBS instance is not yet open or in error, it shall fail and return `NULL`. ]*/
        LogError("put token called while closed or in error");
        result = NULL;
    }
    else
    {
        /* Codes_SRS_CBS_01_025: [ The body of the message MUST be empty. ]*/
        /* Codes_SRS_CBS_01_059: [ `cbs_delete_token_async` shall construct a request message for the `delete-token` operation. ]*/
        MESSAGE_HANDLE message = message_create();
        if (message == NULL)
        {
            /* Codes_SRS_CBS_01_071: [ If constructing the message fails, `cbs_delete_token_async` shall fail and return a non-zero value. ]*/
            LogError("message_create failed");
            result = NULL;
        }
        else
        {
            AMQP_VALUE application_properties = amqpvalue_create_map();
            if (application_properties == NULL)
            {
                /* Codes_SRS_CBS_01_071: [ If constructing the message fails, `cbs_delete_token_async` shall fail and return a non-zero value. ]*/
                LogError("Failed creating application properties map");
                result = NULL;
            }
            else
            {
                if (add_string_key_value_pair_to_map(application_properties, "name", audience) != 0)
                {
                    result = NULL;
                }
                else
                {
                    /* Codes_SRS_CBS_01_021: [ The request message has the following application-properties: ]*/
                    if (message_set_application_properties(message, application_properties) != 0)
                    {
                        /* Codes_SRS_CBS_01_071: [ If constructing the message fails, `cbs_delete_token_async` shall fail and return a non-zero value. ]*/
                        LogError("Failed setting message application properties");
                        result = NULL;
                    }
                    else
                    {
                        result = CREATE_ASYNC_OPERATION(CBS_OPERATION, cbs_put_token_cancel_handler);

                        if (result == NULL)
                        {
                            LogError("Failed allocating async operation context");
                        }
                        else
                        {
                            CBS_OPERATION* cbs_operation = GET_ASYNC_OPERATION_CONTEXT(CBS_OPERATION, result);

                            LIST_ITEM_HANDLE list_item;

                            cbs_operation->on_cbs_operation_complete = on_cbs_delete_token_complete;
                            cbs_operation->on_cbs_operation_complete_context = on_cbs_delete_token_complete_context;
                            cbs_operation->pending_operations = cbs->pending_operations;
                            cbs_operation->token_operation_async_context = result;

                            list_item = singlylinkedlist_add(cbs->pending_operations, cbs_operation);
                            if (list_item == NULL)
                            {
                                LogError("Failed adding pending operation to list");
                                async_operation_destroy(result);
                                result = NULL;
                            }
                            else
                            {
                                /* Codes_SRS_CBS_01_061: [ `cbs_delete_token_async` shall start the AMQP management operation by calling `amqp_management_execute_operation_async`, while passing to it: ]*/
                                /* Codes_SRS_CBS_01_085: [ The `amqp_management` argument shall be the one for the AMQP management instance created in `cbs_create`. ]*/
                                /* Codes_SRS_CBS_01_062: [ The `operation` argument shall be `delete-token`. ]*/
                                /* Codes_SRS_CBS_01_063: [ The `type` argument shall be set to the `type` argument. ]*/
                                /* Codes_SRS_CBS_01_064: [ The `locales` argument shall be set to NULL. ]*/
                                /* Codes_SRS_CBS_01_065: [ The `message` argument shall be the message constructed earlier according to the CBS spec. ]*/
                                /* Codes_SRS_CBS_01_066: [ The arguments `on_operation_complete` and `context` shall be set to a callback that is to be called by the AMQP management module when the operation is complete. ]*/
                                /* Codes_SRS_CBS_01_020: [ To instruct a peer to delete a token associated with a specific audience, a "delete-token" message can be sent to the CBS Node ]*/
                                /* Codes_SRS_CBS_01_022: [ operation    Yes    string    "delete-token" ]*/
                                /* Codes_SRS_CBS_01_023: [ Type    Yes    string    The type of the token being deleted, e.g., "amqp:jwt". ]*/
                                /* Codes_SRS_CBS_01_024: [ name    Yes    string    The "audience" of the token being deleted. ]*/
                                cbs_operation->amqp_management_async_context = amqp_management_execute_operation_async(cbs->amqp_management, "delete-token", type, NULL, message, on_amqp_management_execute_operation_complete, list_item);
                                
                                if (cbs_operation->amqp_management_async_context == NULL)
                                {
                                    /* Codes_SRS_CBS_01_087: [ If `amqp_management_execute_operation_async` fails `cbs_put_token_async` shall fail and return a non-zero value. ]*/
                                    singlylinkedlist_remove(cbs->pending_operations, list_item);
                                    LogError("Failed starting AMQP management operation");
                                    async_operation_destroy(result);
                                    result = NULL;
                                }
                                else
                                {
                                    /* Codes_SRS_CBS_01_082: [ On success `cbs_delete_token_async` shall return an ASYNC_OPERATION_HANDLE. ]*/
                                }
                            }
                        }
                    }
                }

                amqpvalue_destroy(application_properties);
            }

            message_destroy(message);
        }
    }
    return result;
}